

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O0

void __thiscall
cppcms::impl::buddy_allocator::test_consistent
          (buddy_allocator *this,void **allocated,size_t allocated_size)

{
  page *ppVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  mapped_type *pmVar5;
  pointer ppVar6;
  char *pcVar7;
  ulong in_RDX;
  long in_RSI;
  buddy_allocator *in_RDI;
  ostringstream oss_5;
  ostringstream oss_4;
  size_t page_size;
  ostringstream oss_3;
  size_t page_pos;
  ostringstream oss_2;
  map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  *in_stack_00000718;
  buddy_allocator *in_stack_00000720;
  bool is_free;
  page *p_1;
  const_iterator pg;
  size_t pos;
  ostringstream oss_1;
  ostringstream oss;
  page *p;
  size_t i;
  map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  all_pages;
  map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  *in_stack_fffffffffffff468;
  _Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
  *in_stack_fffffffffffff470;
  key_type *in_stack_fffffffffffff4a8;
  map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  *in_stack_fffffffffffff4b0;
  string local_a78 [32];
  ostringstream local_a58 [383];
  undefined1 local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [376];
  long local_740;
  undefined1 local_731;
  string local_730 [32];
  ostringstream local_710 [376];
  ulong local_598;
  undefined1 local_589;
  string local_588 [32];
  ostringstream local_568 [383];
  byte local_3e9;
  page *local_3e8;
  iterator local_3e0;
  _Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_> local_3d8;
  iterator local_3d0;
  _Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_> local_3c8;
  ulong local_3c0;
  undefined1 local_3b1;
  string local_3b0 [32];
  ostringstream local_390 [376];
  _Self local_218;
  _Self local_210;
  undefined1 local_201;
  string local_200 [32];
  ostringstream local_1e0 [376];
  uint *local_68;
  ulong local_60;
  ulong local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
  ::map((map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
         *)0x108a14);
  test_and_get_free_pages(in_stack_00000720,in_stack_00000718);
  local_60 = 0;
  do {
    if (local_18 <= local_60) {
      local_3c0 = 0;
      local_3d0._M_node =
           (_Base_ptr)
           std::
           map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
           ::begin(in_stack_fffffffffffff468);
      std::_Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>::
      _Rb_tree_const_iterator(&local_3c8,&local_3d0);
      while( true ) {
        local_3e0._M_node =
             (_Base_ptr)
             std::
             map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
             ::end(in_stack_fffffffffffff468);
        std::_Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>::
        _Rb_tree_const_iterator(&local_3d8,&local_3e0);
        bVar2 = std::operator!=(&local_3c8,&local_3d8);
        if (!bVar2) {
          if (0x1f < in_RDI->memory_size_ - local_3c0) {
            std::__cxx11::ostringstream::ostringstream(local_a58);
            poVar3 = std::operator<<((ostream *)local_a58,"Error ");
            poVar3 = std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                    );
            poVar3 = std::operator<<(poVar3,":");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb6);
            std::operator<<(poVar3," memory_size_ - pos < size_t(alignment * 2)");
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::runtime_error::runtime_error(prVar4,local_a78);
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
          ::~map((map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
                  *)0x1095e4);
          return;
        }
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
                               *)0x108ef9);
        local_3e8 = ppVar6->first;
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
                               *)0x108f11);
        local_3e9 = ppVar6->second & 1;
        if ((bool)local_3e9 != ((local_3e8->bits & 0x100U) == 0)) {
          std::__cxx11::ostringstream::ostringstream(local_568);
          poVar3 = std::operator<<((ostream *)local_568,"Error ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xaf);
          std::operator<<(poVar3," is_free == !(p->bits & page_in_use)");
          local_589 = 1;
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::str();
          std::runtime_error::runtime_error(prVar4,local_588);
          local_589 = 0;
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
                               *)0x1090e3);
        ppVar1 = ppVar6->first;
        pcVar7 = memory(in_RDI);
        local_598 = (long)ppVar1 - (long)pcVar7;
        if (local_3c0 != local_598) {
          std::__cxx11::ostringstream::ostringstream(local_710);
          poVar3 = std::operator<<((ostream *)local_710,"Error ");
          poVar3 = std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb1);
          std::operator<<(poVar3," pos == page_pos");
          local_731 = 1;
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::str();
          std::runtime_error::runtime_error(prVar4,local_730);
          local_731 = 0;
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>
                               *)0x109290);
        local_740 = 1L << ((byte)ppVar6->first->bits & 0x3f);
        local_3c0 = local_740 + local_3c0;
        if (in_RDI->memory_size_ < local_3c0) break;
        std::_Rb_tree_const_iterator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>::
        operator++(in_stack_fffffffffffff470);
      }
      std::__cxx11::ostringstream::ostringstream(local_8b8);
      poVar3 = std::operator<<((ostream *)local_8b8,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xb4);
      std::operator<<(poVar3," pos <= memory_size_");
      local_8d9 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar4,local_8d8);
      local_8d9 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*(long *)(local_10 + local_60 * 8) != 0) {
      local_68 = (uint *)(*(long *)(local_10 + local_60 * 8) + -0x10);
      if ((*local_68 & 0x100) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_1e0);
        poVar3 = std::operator<<((ostream *)local_1e0,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xa7);
        std::operator<<(poVar3," p->bits & page_in_use");
        local_201 = 1;
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar4,local_200);
        local_201 = 0;
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_210._M_node =
           (_Base_ptr)
           std::
           map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
           ::find(in_stack_fffffffffffff468,(key_type *)0x108c57);
      local_218._M_node =
           (_Base_ptr)
           std::
           map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
           ::end(in_stack_fffffffffffff468);
      bVar2 = std::operator==(&local_210,&local_218);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_390);
        poVar3 = std::operator<<((ostream *)local_390,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xa8);
        std::operator<<(poVar3," all_pages.find(p)==all_pages.end()");
        local_3b1 = 1;
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar4,local_3b0);
        local_3b1 = 0;
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pmVar5 = std::
               map<cppcms::impl::buddy_allocator::page_*,_bool,_std::less<cppcms::impl::buddy_allocator::page_*>,_std::allocator<std::pair<cppcms::impl::buddy_allocator::page_*const,_bool>_>_>
               ::operator[](in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8);
      *pmVar5 = false;
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void test_consistent(void * const *allocated,size_t allocated_size)
	{
		std::map<page *,bool> all_pages;
		test_and_get_free_pages(&all_pages);
		for(size_t i=0;i<allocated_size;i++) {
			if(allocated[i]==0)
				continue;
			page *p=reinterpret_cast<page *>(static_cast<char *>(allocated[i]) - alignment);
			TEST(p->bits & page_in_use);
			TEST(all_pages.find(p)==all_pages.end());
			all_pages[p]=false;
		}
		size_t pos = 0;
		for(std::map<page *,bool>::const_iterator pg=all_pages.begin();pg!=all_pages.end();++pg) {
			page *p=pg->first;
			bool is_free = pg->second;
			TEST(is_free == !(p->bits & page_in_use));
			size_t page_pos = reinterpret_cast<char *>(pg->first) - memory();
			TEST(pos == page_pos);
			size_t page_size = size_t(1) << (pg->first->bits & 0xFF);
			pos+= page_size;
			TEST(pos <= memory_size_);
		}
		TEST(memory_size_ - pos < size_t(alignment * 2));
	}